

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDarLcorrNew(Abc_Ntk_t *pNtk,int nVarsMax,int nConfMax,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  Ssw_Pars_t *pPars;
  Ssw_Pars_t Pars;
  Ssw_Pars_t SStack_d8;
  
  pAVar1 = (Abc_Ntk_t *)0x0;
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig != (Aig_Man_t *)0x0) {
    Ssw_ManSetDefaultParams(&SStack_d8);
    SStack_d8.fLatchCorrOpt = 1;
    SStack_d8.nBTLimit = nConfMax;
    SStack_d8.fVerbose = fVerbose;
    SStack_d8.nSatVarMax = nVarsMax;
    pMan = Ssw_SignalCorrespondence(pAig,&SStack_d8);
    Aig_ManStop(pAig);
    if (pMan == (Aig_Man_t *)0x0) {
      pAVar1 = (Abc_Ntk_t *)0x0;
    }
    else {
      if (pMan->nRegs < pNtk->nObjCounts[8]) {
        pAVar1 = Abc_NtkFromDarSeqSweep(pNtk,pMan);
      }
      else {
        pAVar1 = Abc_NtkFromDar(pNtk,pMan);
        pVVar3 = pAVar1->vBoxes;
        if (0 < pVVar3->nSize) {
          lVar2 = 0;
          do {
            if ((*(uint *)((long)pVVar3->pArray[lVar2] + 0x14) & 0xf) == 8) {
              *(undefined8 *)((long)pVVar3->pArray[lVar2] + 0x38) = 1;
            }
            lVar2 = lVar2 + 1;
            pVVar3 = pAVar1->vBoxes;
          } while (lVar2 < pVVar3->nSize);
        }
      }
      Aig_ManStop(pMan);
    }
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarLcorrNew( Abc_Ntk_t * pNtk, int nVarsMax, int nConfMax, int fVerbose )
{
    Ssw_Pars_t Pars, * pPars = &Pars;
    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig = NULL;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    Ssw_ManSetDefaultParams( pPars );
    pPars->fLatchCorrOpt = 1;
    pPars->nBTLimit      = nConfMax;
    pPars->nSatVarMax    = nVarsMax;
    pPars->fVerbose      = fVerbose;
    pMan = Ssw_SignalCorrespondence( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );
    if ( pMan )
    {
        if ( Aig_ManRegNum(pMan) < Abc_NtkLatchNum(pNtk) )
            pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
        else
        {
            Abc_Obj_t * pObj;
            int i;
            pNtkAig = Abc_NtkFromDar( pNtk, pMan );
            Abc_NtkForEachLatch( pNtkAig, pObj, i )
                Abc_LatchSetInit0( pObj );
        }
        Aig_ManStop( pMan );
    }
    return pNtkAig;
}